

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O0

bool __thiscall
httplib::Server::handle_file_request(Server *this,Request *req,Response *res,bool head)

{
  bool bVar1;
  undefined1 uVar2;
  int iVar3;
  ulong uVar4;
  string *psVar5;
  char *pcVar6;
  element_type *peVar7;
  byte in_CL;
  Request *in_RDX;
  long in_RSI;
  string *in_RDI;
  shared_ptr<httplib::detail::mmap> mm;
  value_type *kv;
  const_iterator __end5;
  const_iterator __begin5;
  Headers *__range5;
  FileStat stat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> path;
  string sub_path;
  MountPointEntry *entry;
  iterator __end1;
  iterator __begin1;
  vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
  *__range1;
  string *in_stack_fffffffffffffd88;
  Response *in_stack_fffffffffffffd90;
  Request *in_stack_fffffffffffffd98;
  Response *in_stack_fffffffffffffda0;
  Request *in_stack_fffffffffffffdb0;
  undefined7 in_stack_fffffffffffffdb8;
  int stat_00;
  Response *in_stack_fffffffffffffde0;
  ContentProvider *in_stack_fffffffffffffde8;
  undefined8 in_stack_fffffffffffffdf0;
  undefined8 in_stack_fffffffffffffdf8;
  Response *in_stack_fffffffffffffe00;
  string local_1d0 [32];
  size_type local_1b0;
  reference local_198;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_190;
  _Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true>
  local_188;
  Headers *local_180;
  int local_174;
  string local_170 [32];
  FileStat local_150;
  string local_b8 [16];
  string *in_stack_ffffffffffffff58;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_ffffffffffffff60;
  string *in_stack_ffffffffffffff68;
  string local_88 [32];
  string local_68 [32];
  reference local_48;
  MountPointEntry *local_40;
  __normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
  local_38;
  string *local_30;
  byte local_21;
  Request *local_20;
  long local_18;
  byte local_1;
  
  local_21 = in_CL & 1;
  local_30 = in_RDI + 4;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_38._M_current =
       (MountPointEntry *)
       detail::std::
       vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>::
       begin((vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
              *)in_stack_fffffffffffffd88);
  local_40 = (MountPointEntry *)
             detail::std::
             vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
             ::end((vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>
                    *)in_stack_fffffffffffffd88);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
                             *)in_stack_fffffffffffffd90,
                            (__normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
                             *)in_stack_fffffffffffffd88), bVar1) {
    local_48 = __gnu_cxx::
               __normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
               ::operator*(&local_38);
    uVar4 = local_18 + 0x20;
    psVar5 = (string *)std::__cxx11::string::size();
    iVar3 = std::__cxx11::string::compare(uVar4,0,psVar5);
    stat_00 = (int)(uVar4 >> 0x20);
    if (iVar3 == 0) {
      uVar4 = local_18 + 0x20;
      std::__cxx11::string::size();
      std::__cxx11::string::substr((ulong)local_88,uVar4);
      std::operator+((char *)in_stack_fffffffffffffd98,&in_stack_fffffffffffffd90->version);
      std::__cxx11::string::~string(local_88);
      uVar2 = detail::is_valid_path(in_RDI);
      if ((bool)uVar2) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       CONCAT17(uVar2,in_stack_fffffffffffffdb8),&in_stack_fffffffffffffdb0->method)
        ;
        pcVar6 = (char *)std::__cxx11::string::back();
        if (*pcVar6 == '/') {
          std::__cxx11::string::operator+=(local_b8,"index.html");
        }
        detail::FileStat::FileStat((FileStat *)in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
        bVar1 = detail::FileStat::is_dir(&local_150);
        if (bVar1) {
          in_stack_fffffffffffffdb0 = local_20;
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         CONCAT17(uVar2,in_stack_fffffffffffffdb8),(char *)local_20);
          Response::set_redirect(in_stack_fffffffffffffde0,in_RDI,stat_00);
          std::__cxx11::string::~string(local_170);
          local_1 = 1;
          local_174 = 1;
        }
        else {
          bVar1 = detail::FileStat::is_file(&local_150);
          if (bVar1) {
            local_180 = &local_48->headers;
            local_188._M_cur =
                 (__node_type *)
                 detail::std::
                 unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::case_ignore::hash,_httplib::detail::case_ignore::equal_to,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::begin((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::case_ignore::hash,_httplib::detail::case_ignore::equal_to,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)in_stack_fffffffffffffd88);
            local_190._M_cur =
                 (__node_type *)
                 detail::std::
                 unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::case_ignore::hash,_httplib::detail::case_ignore::equal_to,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::end((unordered_multimap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_httplib::detail::case_ignore::hash,_httplib::detail::case_ignore::equal_to,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffffd88);
            while (bVar1 = detail::std::__detail::operator!=(&local_188,&local_190), bVar1) {
              local_198 = detail::std::__detail::
                          _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                          ::operator*((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                                       *)0x235da3);
              Response::set_header
                        (in_stack_fffffffffffffda0,&in_stack_fffffffffffffd98->method,
                         &in_stack_fffffffffffffd90->version);
              detail::std::__detail::
              _Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
              ::operator++((_Node_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false,_true>
                            *)in_stack_fffffffffffffd90);
            }
            local_1b0 = std::__cxx11::string::c_str();
            std::make_shared<httplib::detail::mmap,char_const*>
                      ((char **)CONCAT17(uVar2,in_stack_fffffffffffffdb8));
            peVar7 = detail::std::
                     __shared_ptr_access<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x235e13);
            bVar1 = detail::mmap::is_open(peVar7);
            if (bVar1) {
              in_stack_fffffffffffffd98 = local_20;
              peVar7 = detail::std::
                       __shared_ptr_access<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<httplib::detail::mmap,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)0x235e76);
              in_stack_fffffffffffffda0 = (Response *)detail::mmap::size(peVar7);
              detail::find_content_type
                        (in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff58);
              in_stack_fffffffffffffd90 = (Response *)&stack0xfffffffffffffe00;
              detail::std::shared_ptr<httplib::detail::mmap>::shared_ptr
                        ((shared_ptr<httplib::detail::mmap> *)in_stack_fffffffffffffd90,
                         (shared_ptr<httplib::detail::mmap> *)in_stack_fffffffffffffd88);
              std::function<bool(unsigned_long,unsigned_long,httplib::DataSink&)>::
              function<httplib::Server::handle_file_request(httplib::Request_const&,httplib::Response&,bool)::_lambda(unsigned_long,unsigned_long,httplib::DataSink&)_1_,void>
                        ((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                         in_stack_fffffffffffffda0,
                         (anon_class_16_1_3fcf665e *)in_stack_fffffffffffffd98);
              in_stack_fffffffffffffd88 = (string *)&stack0xfffffffffffffde0;
              detail::std::function<void_(bool)>::function
                        ((function<void_(bool)> *)in_stack_fffffffffffffd90,
                         in_stack_fffffffffffffd88);
              Response::set_content_provider
                        (in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8,
                         (string *)in_stack_fffffffffffffdf0,in_stack_fffffffffffffde8,
                         (ContentProviderResourceReleaser *)in_stack_fffffffffffffde0);
              detail::std::function<void_(bool)>::~function((function<void_(bool)> *)0x235f1e);
              detail::std::function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)>::
              ~function((function<bool_(unsigned_long,_unsigned_long,_httplib::DataSink_&)> *)
                        0x235f2b);
              handle_file_request(httplib::Request_const&,httplib::Response&,bool)::
              {lambda(unsigned_long,unsigned_long,httplib::DataSink&)#1}::~DataSink
                        ((anon_class_16_1_3fcf665e *)0x235f35);
              std::__cxx11::string::~string(local_1d0);
              if (((local_21 & 1) == 0) &&
                 (bVar1 = std::function::operator_cast_to_bool
                                    ((function<void_(const_httplib::Request_&,_httplib::Response_&)>
                                      *)0x235f61), bVar1)) {
                detail::std::function<void_(const_httplib::Request_&,_httplib::Response_&)>::
                operator()((function<void_(const_httplib::Request_&,_httplib::Response_&)> *)
                           in_stack_fffffffffffffda0,in_stack_fffffffffffffd98,
                           in_stack_fffffffffffffd90);
              }
              local_1 = 1;
            }
            else {
              local_1 = 0;
            }
            local_174 = 1;
            detail::std::shared_ptr<httplib::detail::mmap>::~shared_ptr
                      ((shared_ptr<httplib::detail::mmap> *)0x236006);
          }
          else {
            local_174 = 0;
          }
        }
        std::__cxx11::string::~string(local_b8);
        if (local_174 == 0) goto LAB_0023604d;
      }
      else {
LAB_0023604d:
        local_174 = 0;
      }
      std::__cxx11::string::~string(local_68);
      if (local_174 != 0) goto LAB_002360a1;
    }
    __gnu_cxx::
    __normal_iterator<httplib::Server::MountPointEntry_*,_std::vector<httplib::Server::MountPointEntry,_std::allocator<httplib::Server::MountPointEntry>_>_>
    ::operator++(&local_38);
  }
  local_1 = 0;
LAB_002360a1:
  return (bool)(local_1 & 1);
}

Assistant:

inline bool Server::handle_file_request(const Request &req, Response &res,
                                        bool head) {
  for (const auto &entry : base_dirs_) {
    // Prefix match
    if (!req.path.compare(0, entry.mount_point.size(), entry.mount_point)) {
      std::string sub_path = "/" + req.path.substr(entry.mount_point.size());
      if (detail::is_valid_path(sub_path)) {
        auto path = entry.base_dir + sub_path;
        if (path.back() == '/') { path += "index.html"; }

        detail::FileStat stat(path);

        if (stat.is_dir()) {
          res.set_redirect(sub_path + "/", StatusCode::MovedPermanently_301);
          return true;
        }

        if (stat.is_file()) {
          for (const auto &kv : entry.headers) {
            res.set_header(kv.first, kv.second);
          }

          auto mm = std::make_shared<detail::mmap>(path.c_str());
          if (!mm->is_open()) { return false; }

          res.set_content_provider(
              mm->size(),
              detail::find_content_type(path, file_extension_and_mimetype_map_,
                                        default_file_mimetype_),
              [mm](size_t offset, size_t length, DataSink &sink) -> bool {
                sink.write(mm->data() + offset, length);
                return true;
              });

          if (!head && file_request_handler_) {
            file_request_handler_(req, res);
          }

          return true;
        }
      }
    }
  }
  return false;
}